

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cpp
# Opt level: O3

int __thiscall ncnn::RNN::load_model(RNN *this,ModelBin *mb)

{
  int *piVar1;
  void *pvVar2;
  Allocator *pAVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  void *local_78;
  int *local_70;
  size_t local_68;
  int local_60;
  Allocator *local_58;
  int local_50;
  int iStack_4c;
  int iStack_48;
  int iStack_44;
  int local_40;
  size_t local_38;
  
  uVar5 = (this->direction == 2) + 1;
  uVar4 = (long)this->weight_data_size / (long)(int)uVar5;
  (*mb->_vptr_ModelBin[4])
            (&local_78,mb,
             (long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
             (long)this->num_output & 0xffffffff,(ulong)(uint)this->num_output,(ulong)uVar5,0);
  if (&this->weight_xc_data != (Mat *)&local_78) {
    if (local_70 != (int *)0x0) {
      LOCK();
      *local_70 = *local_70 + 1;
      UNLOCK();
    }
    piVar1 = (this->weight_xc_data).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = (this->weight_xc_data).data;
        pAVar3 = (this->weight_xc_data).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        else {
          (*pAVar3->_vptr_Allocator[3])();
        }
      }
    }
    (this->weight_xc_data).data = local_78;
    (this->weight_xc_data).refcount = local_70;
    (this->weight_xc_data).elemsize = local_68;
    (this->weight_xc_data).elempack = local_60;
    (this->weight_xc_data).allocator = local_58;
    (this->weight_xc_data).dims = local_50;
    (this->weight_xc_data).w = iStack_4c;
    (this->weight_xc_data).h = iStack_48;
    (this->weight_xc_data).d = iStack_44;
    (this->weight_xc_data).c = local_40;
    (this->weight_xc_data).cstep = local_38;
  }
  if (local_70 != (int *)0x0) {
    LOCK();
    *local_70 = *local_70 + -1;
    UNLOCK();
    if (*local_70 == 0) {
      if (local_58 == (Allocator *)0x0) {
        if (local_78 != (void *)0x0) {
          free(local_78);
        }
      }
      else {
        (*local_58->_vptr_Allocator[3])();
      }
    }
  }
  iVar6 = -100;
  if (((this->weight_xc_data).data != (void *)0x0) &&
     ((long)(this->weight_xc_data).c * (this->weight_xc_data).cstep != 0)) {
    (*mb->_vptr_ModelBin[4])(&local_78,mb,(ulong)(uint)this->num_output,1,(ulong)uVar5,0);
    if (&this->bias_c_data != (Mat *)&local_78) {
      if (local_70 != (int *)0x0) {
        LOCK();
        *local_70 = *local_70 + 1;
        UNLOCK();
      }
      piVar1 = (this->bias_c_data).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pvVar2 = (this->bias_c_data).data;
          pAVar3 = (this->bias_c_data).allocator;
          if (pAVar3 == (Allocator *)0x0) {
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
          }
          else {
            (*pAVar3->_vptr_Allocator[3])();
          }
        }
      }
      (this->bias_c_data).data = local_78;
      (this->bias_c_data).refcount = local_70;
      (this->bias_c_data).elemsize = local_68;
      (this->bias_c_data).elempack = local_60;
      (this->bias_c_data).allocator = local_58;
      (this->bias_c_data).dims = local_50;
      (this->bias_c_data).w = iStack_4c;
      (this->bias_c_data).h = iStack_48;
      (this->bias_c_data).d = iStack_44;
      (this->bias_c_data).c = local_40;
      (this->bias_c_data).cstep = local_38;
    }
    if (local_70 != (int *)0x0) {
      LOCK();
      *local_70 = *local_70 + -1;
      UNLOCK();
      if (*local_70 == 0) {
        if (local_58 == (Allocator *)0x0) {
          if (local_78 != (void *)0x0) {
            free(local_78);
          }
        }
        else {
          (*local_58->_vptr_Allocator[3])();
        }
      }
    }
    if (((this->bias_c_data).data != (void *)0x0) &&
       ((long)(this->bias_c_data).c * (this->bias_c_data).cstep != 0)) {
      (*mb->_vptr_ModelBin[4])
                (&local_78,mb,(ulong)(uint)this->num_output,(ulong)(uint)this->num_output,
                 (ulong)uVar5,0);
      if (&this->weight_hc_data != (Mat *)&local_78) {
        if (local_70 != (int *)0x0) {
          LOCK();
          *local_70 = *local_70 + 1;
          UNLOCK();
        }
        piVar1 = (this->weight_hc_data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pvVar2 = (this->weight_hc_data).data;
            pAVar3 = (this->weight_hc_data).allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
            }
            else {
              (*pAVar3->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_hc_data).data = local_78;
        (this->weight_hc_data).refcount = local_70;
        (this->weight_hc_data).elemsize = local_68;
        (this->weight_hc_data).elempack = local_60;
        (this->weight_hc_data).allocator = local_58;
        (this->weight_hc_data).dims = local_50;
        (this->weight_hc_data).w = iStack_4c;
        (this->weight_hc_data).h = iStack_48;
        (this->weight_hc_data).d = iStack_44;
        (this->weight_hc_data).c = local_40;
        (this->weight_hc_data).cstep = local_38;
      }
      if (local_70 != (int *)0x0) {
        LOCK();
        *local_70 = *local_70 + -1;
        UNLOCK();
        if (*local_70 == 0) {
          if (local_58 == (Allocator *)0x0) {
            if (local_78 != (void *)0x0) {
              free(local_78);
            }
          }
          else {
            (*local_58->_vptr_Allocator[3])();
          }
        }
      }
      if (((this->weight_hc_data).data == (void *)0x0) ||
         (iVar6 = 0, (long)(this->weight_hc_data).c * (this->weight_hc_data).cstep == 0)) {
        iVar6 = -100;
      }
    }
  }
  return iVar6;
}

Assistant:

int RNN::load_model(const ModelBin& mb)
{
    int num_directions = direction == 2 ? 2 : 1;

    int size = weight_data_size / num_directions / num_output;

    // raw weight data
    weight_xc_data = mb.load(size, num_output, num_directions, 0);
    if (weight_xc_data.empty())
        return -100;

    bias_c_data = mb.load(num_output, 1, num_directions, 0);
    if (bias_c_data.empty())
        return -100;

    weight_hc_data = mb.load(num_output, num_output, num_directions, 0);
    if (weight_hc_data.empty())
        return -100;

    return 0;
}